

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

void __thiscall
t_haxe_generator::generate_service_client(t_haxe_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  pointer pcVar4;
  t_struct *ptVar5;
  int iVar6;
  undefined4 extraout_var;
  long *plVar7;
  ostream *poVar8;
  t_function *ptVar9;
  size_type *psVar10;
  char *pcVar11;
  char *__end;
  pointer pptVar12;
  pointer pptVar13;
  string funname;
  string appex;
  string retval;
  string argsname;
  string result;
  string resultname;
  string args;
  string extends;
  string msg;
  string calltype;
  string extends_client;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_330;
  string local_310;
  pointer local_2f0;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  string local_1c8;
  char *local_1a8;
  long local_1a0;
  char local_198 [16];
  vector<t_function_*,_std::allocator<t_function_*>_> local_188;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"","");
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"","");
  if (tservice->extends_ != (t_service *)0x0) {
    iVar6 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    lVar3 = *(long *)CONCAT44(extraout_var,iVar6);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar3,((long *)CONCAT44(extraout_var,iVar6))[1] + lVar3);
    get_cap_name(&local_330,this,&local_50);
    std::__cxx11::string::operator=((string *)&local_248,(string *)&local_330);
    paVar2 = &local_330.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::operator+(&local_2c8," extends ",&local_248);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_330.field_2._M_allocated_capacity = *psVar10;
      local_330.field_2._8_8_ = plVar7[3];
      local_330._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_330.field_2._M_allocated_capacity = *psVar10;
      local_330._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_330._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
  }
  out = &this->f_service_;
  generate_rtti_decoration(this,(ostream *)out);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"class ",6);
  pcVar4 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  get_cap_name(&local_330,this,&local_70);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_330._M_dataplus._M_p,local_330._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Impl",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1a8,local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," implements ",0xc);
  pcVar4 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  get_cap_name(&local_2c8,this,&local_90);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," {",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"public function new( iprot : TProtocol, oprot : TProtocol = null)",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)out);
  if (local_248._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot_ = iprot;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (oprot == null) {",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot_ = iprot;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} else {",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot_ = oprot;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"super(iprot, oprot);",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_248._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"private var iprot_ : TProtocol;",0x1f);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"private var oprot_ : TProtocol;",0x1f);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"private var seqid_ : Int;",0x19);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"public function getInputProtocol() : TProtocol",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)out);
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return this.iprot_;",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
    ;
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"public function getOutputProtocol() : TProtocol",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)out);
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return this.oprot_;",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
    ;
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_188,&tservice->functions_)
  ;
  pptVar12 = local_188.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_188.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      pcVar4 = ((*pptVar12)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330,pcVar4,pcVar4 + ((*pptVar12)->name_)._M_string_length);
      generate_service_method_signature_combined(this,*pptVar12,false);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      ptVar9 = *pptVar12;
      ptVar5 = ptVar9->arglist_;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      pcVar4 = (ptVar9->name_)._M_dataplus._M_p;
      local_2f0 = pptVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar4,pcVar4 + (ptVar9->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_1c8);
      get_cap_name(&local_2c8,this,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"args","");
      t_generator::tmp(&local_268,(t_generator *)this,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      pcVar11 = "CALL";
      if ((*local_2f0)->oneway_ != false) {
        pcVar11 = "ONEWAY";
      }
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,pcVar11,pcVar11 + (ulong)(*local_2f0)->oneway_ * 2 + 4);
      t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"oprot_.writeMessageBegin(new TMessage(\"",0x27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_330._M_dataplus._M_p,local_330._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\", TMessageType.",0x10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1e8,local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", seqid_));",0xb);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"var ",4);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," = new ",7);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"();",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      for (pptVar13 = (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar13 !=
          (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
        t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_268._M_dataplus._M_p,local_268._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((*pptVar13)->name_)._M_dataplus._M_p,
                            ((*pptVar13)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((*pptVar13)->name_)._M_dataplus._M_p,
                            ((*pptVar13)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".write(oprot_);",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot_.writeMessageEnd();",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"retval","");
      t_generator::tmp(&local_2e8,(t_generator *)this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (((*local_2f0)->oneway_ == false) &&
         (iVar6 = (*((*local_2f0)->returntype_->super_t_doc)._vptr_t_doc[4])(), (char)iVar6 == '\0')
         ) {
        t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,local_310._M_dataplus._M_p,local_310._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"var ",4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
        type_name_abi_cxx11_(&local_288,this,(*local_2f0)->returntype_,false,false);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_288._M_dataplus._M_p,local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
      }
      if ((*local_2f0)->oneway_ == true) {
        t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,local_310._M_dataplus._M_p,local_310._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"oprot_.getTransport().flush();",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"oprot_.getTransport().flush(function(error:Dynamic) : Void {",0x3c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"try {",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"appex","");
        t_generator::tmp(&local_310,(t_generator *)this,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"var ",4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," : TApplicationException;",0x19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        pcVar4 = ((*local_2f0)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar4,pcVar4 + ((*local_2f0)->name_)._M_string_length);
        std::__cxx11::string::append((char *)&local_208);
        get_cap_name(&local_288,this,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (error != null) {",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (onError == null)",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"throw error;",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"onError(error);",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"msg","");
        t_generator::tmp(&local_228,(t_generator *)this,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"var ",4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," : TMessage = iprot_.readMessageBegin();",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (",4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,".type == TMessageType.EXCEPTION) {",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," = TApplicationException.read(iprot_);",0x26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot_.readMessageEnd();",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (onError == null)",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"throw ",6);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"onError(",8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"result","");
        t_generator::tmp(&local_2a8,(t_generator *)this,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"var ",4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_288._M_dataplus._M_p,local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = new ",7);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_288._M_dataplus._M_p,local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"",0);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,".read(iprot_);",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot_.readMessageEnd();",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        iVar6 = (*((*local_2f0)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar6 == '\0') {
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (",4);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"success","");
          generate_isset_check(&local_150,this,&local_170);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_150._M_dataplus._M_p,local_150._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") {",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (onSuccess != null)",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"onSuccess(",10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,".success);",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,".success;",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        ptVar9 = *local_2f0;
        ptVar5 = ptVar9->xceptions_;
        pptVar13 = (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (pptVar13 !=
            (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (",4);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*pptVar13)->name_)._M_dataplus._M_p,
                                ((*pptVar13)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," != null) {",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (onError == null)",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"throw ",6);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*pptVar13)->name_)._M_dataplus._M_p,
                                ((*pptVar13)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"onError(",8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*pptVar13)->name_)._M_dataplus._M_p,
                                ((*pptVar13)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            pptVar13 = pptVar13 + 1;
          } while (pptVar13 !=
                   (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
          ptVar9 = *local_2f0;
        }
        iVar6 = (*(ptVar9->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar6 == '\0') {
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," = new TApplicationException(",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"TApplicationException.MISSING_RESULT,",0x25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,((*local_2f0)->name_)._M_dataplus._M_p,
                              ((*local_2f0)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," failed: unknown result\");",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (onError == null)",0x14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"throw ",6);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"onError(",8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
        }
        else {
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (onSuccess != null)",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"onSuccess();",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} catch( e : TException) {",0x1a)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (onError == null)",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"throw e;",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"onError(e);",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"});",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if (((*local_2f0)->oneway_ == false) &&
         (iVar6 = (*((*local_2f0)->returntype_->super_t_doc)._vptr_t_doc[4])(), (char)iVar6 == '\0')
         ) {
        t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,local_310._M_dataplus._M_p,local_310._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return ",7);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      pptVar12 = local_2f0 + 1;
    } while (local_2f0 + 1 !=
             local_188.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_188.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_haxe_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_cap_name(tservice->get_extends()->get_name());
    extends_client = " extends " + extends + "Impl";
  }

  generate_rtti_decoration(f_service_);
  // build macro is inherited from interface
  indent(f_service_) << "class " << get_cap_name(service_name_) << "Impl" << extends_client
                     << " implements " << get_cap_name(service_name_) << " {" << endl << endl;
  indent_up();

  indent(f_service_) << "public function new( iprot : TProtocol, oprot : TProtocol = null)" << endl;
  scope_up(f_service_);
  if (extends.empty()) {
    f_service_ << indent() << "iprot_ = iprot;" << endl;
    f_service_ << indent() << "if (oprot == null) {" << endl;
    indent_up();
    f_service_ << indent() << "oprot_ = iprot;" << endl;
    indent_down();
    f_service_ << indent() << "} else {" << endl;
    indent_up();
    f_service_ << indent() << "oprot_ = oprot;" << endl;
    indent_down();
    f_service_ << indent() << "}" << endl;
  } else {
    f_service_ << indent() << "super(iprot, oprot);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  if (extends.empty()) {
    f_service_ << indent() << "private var iprot_ : TProtocol;" << endl << indent()
               << "private var oprot_ : TProtocol;" << endl << indent()
               << "private var seqid_ : Int;" << endl << endl;

    indent(f_service_) << "public function getInputProtocol() : TProtocol" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.iprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;

    indent(f_service_) << "public function getOutputProtocol() : TProtocol" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.oprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();

    // Open function
    generate_service_method_signature(*f_iter, false, true);

    indent_up();

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    string argsname = get_cap_name((*f_iter)->get_name() + "_args");
    vector<t_field*>::const_iterator fld_iter;
    const vector<t_field*>& fields = arg_struct->get_members();

    // Serialize the request
    string args = tmp("args");
    string calltype = (*f_iter)->is_oneway() ? "ONEWAY" : "CALL";
    f_service_ << indent() << "oprot_.writeMessageBegin(new TMessage(\"" << funname
               << "\", TMessageType." << calltype << ", seqid_));" << endl << indent()
               << "var " << args << " : " << argsname << " = new " << argsname << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << args << "." << (*fld_iter)->get_name() << " = "
                 << (*fld_iter)->get_name() << ";" << endl;
    }

    f_service_ << indent() << args << ".write(oprot_);" << endl << indent()
               << "oprot_.writeMessageEnd();" << endl;

    string retval = tmp("retval");
    if (!((*f_iter)->is_oneway() || (*f_iter)->get_returntype()->is_void())) {
      f_service_ << indent() << "var " << retval << " : " << type_name((*f_iter)->get_returntype()) << ";"
                 << endl;
    }

    if ((*f_iter)->is_oneway()) {
      f_service_ << indent() << "oprot_.getTransport().flush();" << endl;
    } else {
      indent(f_service_) << "oprot_.getTransport().flush(function(error:Dynamic) : Void {" << endl;
      indent_up();
      indent(f_service_) << "try {" << endl;
      indent_up();
      string appex = tmp("appex");
      indent(f_service_) << "var " << appex << " : TApplicationException;" << endl;
      string resultname = get_cap_name((*f_iter)->get_name() + "_result");
      indent(f_service_) << "if (error != null) {" << endl;
      indent_up();
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw error;" << endl;
      indent_down();
      indent(f_service_) << "onError(error);" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl << endl;
      string msg = tmp("msg");
      indent(f_service_) << "var " << msg << " : TMessage = iprot_.readMessageBegin();" << endl;
      indent(f_service_) << "if (" << msg << ".type == TMessageType.EXCEPTION) {" << endl;
      indent_up();
      indent(f_service_) << appex << " = TApplicationException.read(iprot_);" << endl;
      indent(f_service_) << "iprot_.readMessageEnd();" << endl;
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw " << appex << ";" << endl;
      indent_down();
      indent(f_service_) << "onError(" << appex << ");" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl << endl;
      string result = tmp("result");
      indent(f_service_) << "var " << result << " : " << resultname << " = new " << resultname << "();" << endl;
      indent(f_service_) << "" << result << ".read(iprot_);" << endl;
      indent(f_service_) << "iprot_.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (" << result << "." << generate_isset_check("success") << ") {" << endl;
        indent_up();
        indent(f_service_) << "if (onSuccess != null)" << endl;
        indent_up();
        indent(f_service_) << "onSuccess(" << result << ".success);" << endl;
        indent_down();
        indent(f_service_) << retval << " = " << result << ".success;" << endl;
        indent(f_service_) << "return;" << endl;
        indent_down();
        indent(f_service_) << "}" << endl << endl;
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        indent(f_service_) << "if (" << result << "." << (*x_iter)->get_name() << " != null) {" << endl;
        indent_up();
        indent(f_service_) << "if (onError == null)" << endl;
        indent_up();
        indent(f_service_) << "throw " << result << "." << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        indent(f_service_) << "onError(" << result << "." << (*x_iter)->get_name() << ");" << endl;
        indent(f_service_) << "return;" << endl;
        indent_down();
        indent(f_service_) << "}" << endl << endl;
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (onSuccess != null)" << endl;
        indent_up();
        indent(f_service_) << "onSuccess();" << endl;
        indent_down();
        indent(f_service_) << "return;" << endl;
      } else {
        indent(f_service_) << appex << " = new TApplicationException("
                           << "TApplicationException.MISSING_RESULT,"
                           << "\"" << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
        indent(f_service_) << "if (onError == null)" << endl;
        indent_up();
        indent(f_service_) << "throw " << appex << ";" << endl;
        indent_down();
        indent(f_service_) << "onError(" << appex << ");" << endl;
        indent(f_service_) << "return;" << endl;
      }

      indent_down();
      indent(f_service_) << endl;
      indent(f_service_) << "} catch( e : TException) {" << endl;
      indent_up();
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw e;" << endl;
      indent_down();
      indent(f_service_) << "onError(e);" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl;

      indent_down();
      indent(f_service_) << "});" << endl << endl;
    }

    if (!((*f_iter)->is_oneway() || (*f_iter)->get_returntype()->is_void())) {
      f_service_ << indent() << "return " << retval << ";" << endl;
    }

    // Close function
    scope_down(f_service_);
    f_service_ << endl;
  }

  indent_down();
  indent(f_service_) << "}" << endl;
}